

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

int_t * intCalloc(int_t n)

{
  int_t *piVar1;
  ulong uVar2;
  ulong uVar3;
  char msg [256];
  char acStack_118 [256];
  
  piVar1 = (int_t *)malloc((long)n << 2);
  if (piVar1 == (int_t *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in intCalloc()",
            0xb9,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/memory.c"
           );
    superlu_abort_and_exit(acStack_118);
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = 0;
  }
  return piVar1;
}

Assistant:

int_t *intCalloc(int_t n)
{
    int_t *buf;
    register int_t i;
    buf = (int_t *) SUPERLU_MALLOC(n * sizeof(int_t));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC fails for buf in intCalloc()");
    }
    for (i = 0; i < n; ++i) buf[i] = 0;
    return (buf);
}